

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::i2p_connection::
open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_connection *this,string *hostname,int port,i2p_session_options *session_options,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  __type_conflict1 _Var1;
  bool bVar2;
  ulong uVar3;
  difference_type dVar4;
  element_type *peVar5;
  char *id;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *u;
  difference_type extraout_RDX;
  span<char> buffer;
  span<const_char> in;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_120;
  i2p_connection *local_108;
  shared_ptr<libtorrent::i2p_stream> local_100;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:509:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  local_f0;
  basic_endpoint<boost::asio::ip::tcp> local_c0;
  string local_98;
  io_context local_78;
  aux *local_68;
  char *local_60;
  span<char> local_58;
  char local_48 [8];
  char tmp [20];
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *handler_local;
  i2p_session_options *session_options_local;
  int port_local;
  string *hostname_local;
  i2p_connection *this_local;
  
  u = (_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
       *)session_options;
  unique0x10000329 = handler;
  _Var1 = ::std::operator==(&this->m_hostname,hostname);
  if ((((!_Var1) || (this->m_port != port)) ||
      (bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this), !bVar2)) ||
     ((bVar2 = is_open(this), !bVar2 && (this->m_state != sam_connecting)))) {
    ::std::__cxx11::string::operator=((string *)&this->m_hostname,(string *)hostname);
    this->m_port = port;
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      this->m_state = sam_connecting;
      span<char>::span<char,20l>(&local_58,(char (*) [20])local_48);
      buffer.m_len = extraout_RDX;
      buffer.m_ptr = (char *)local_58.m_len;
      libtorrent::aux::random_bytes((aux *)local_58.m_ptr,buffer);
      ::std::__cxx11::string::resize((ulong)&this->m_session_id);
      span<char_const>::span<char,20l>((span<char_const> *)&local_68,(char (*) [20])local_48);
      dVar4 = ::std::__cxx11::string::operator[]((ulong)&this->m_session_id);
      in.m_len = dVar4;
      in.m_ptr = local_60;
      libtorrent::aux::to_hex(local_68,in,(char *)u);
      ::std::make_shared<libtorrent::i2p_stream,boost::asio::io_context&>(&local_78);
      ::std::shared_ptr<libtorrent::i2p_stream>::operator=
                (&this->m_sam_socket,(shared_ptr<libtorrent::i2p_stream> *)&local_78);
      ::std::shared_ptr<libtorrent::i2p_stream>::~shared_ptr
                ((shared_ptr<libtorrent::i2p_stream> *)&local_78);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      ::std::__cxx11::string::string((string *)&local_98,(string *)&this->m_hostname);
      libtorrent::aux::proxy_base::set_proxy(&peVar5->super_proxy_base,&local_98,this->m_port);
      ::std::__cxx11::string::~string((string *)&local_98);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      i2p_stream::set_command(peVar5,cmd_create_session);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      id = (char *)::std::__cxx11::string::c_str();
      i2p_stream::set_session_id(peVar5,id);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      i2p_stream::set_session_options(peVar5,session_options);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(&local_c0);
      local_108 = this;
      ::std::shared_ptr<libtorrent::i2p_stream>::shared_ptr(&local_100,&this->m_sam_socket);
      ::std::
      _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
      ::_Bind(&local_120,handler);
      libtorrent::aux::
      wrap_allocator<libtorrent::i2p_connection::open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::__cxx11::string_const&,int,libtorrent::i2p_session_options_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
                (&local_f0,(aux *)&local_108,(anon_class_24_2_fd512de0_for_m_handler *)&local_120,u)
      ;
      i2p_stream::
      async_connect<libtorrent::aux::wrap_allocator_t<libtorrent::i2p_connection::open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::__cxx11::string_const&,int,libtorrent::i2p_session_options_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)::_lambda(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)_1_,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>>
                (peVar5,&local_c0,&local_f0);
      libtorrent::aux::
      wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:509:4),_std::_Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
      ::~wrap_allocator_t(&local_f0);
      open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>(std::__cxx11::string_const&,int,libtorrent::i2p_session_options_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)
      ::
      {lambda(boost::system::error_code_const&,std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>)#1}
      ::~i2p_session_options
                ((_lambda_boost__system__error_code_const__std___Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>__1_
                  *)&local_108);
    }
  }
  return;
}

Assistant:

void open(std::string const& hostname, int port,
		i2p_session_options const& session_options, Handler handler)
	{
		// we already seem to have a session to this SAM router
		if (m_hostname == hostname
			&& m_port == port
			&& m_sam_socket
			&& (is_open() || m_state == sam_connecting)) return;

		m_hostname = hostname;
		m_port = port;

		if (m_hostname.empty()) return;

		m_state = sam_connecting;

		char tmp[20];
		aux::random_bytes(tmp);
		m_session_id.resize(sizeof(tmp)*2);
		aux::to_hex(tmp, &m_session_id[0]);

		m_sam_socket = std::make_shared<i2p_stream>(m_io_service);
		m_sam_socket->set_proxy(m_hostname, m_port);
		m_sam_socket->set_command(i2p_stream::cmd_create_session);
		m_sam_socket->set_session_id(m_session_id.c_str());
		m_sam_socket->set_session_options(session_options);

		ADD_OUTSTANDING_ASYNC("i2p_stream::on_sam_connect");
		m_sam_socket->async_connect(tcp::endpoint(), aux::wrap_allocator(
			[this,s=m_sam_socket](error_code const& ec, Handler hn) {
				on_sam_connect(ec, s, std::move(hn));
			}, std::move(handler)));
	}